

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int crazyRead(void *context,char *buffer,int len)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  if (((context == (void *)0x0) || (buffer == (char *)0x0)) || (len < 0)) {
    context_local._4_4_ = -1;
  }
  else {
    iVar1 = check_time();
    if ((iVar1 < 1) && (instate == 1)) {
      fprintf(_stderr,"\ntimeout in crazy(%d)\n",(ulong)crazy_indx);
      sVar2 = strlen(crazy);
      rlen = (int)sVar2 - crazy_indx;
      current = crazy + crazy_indx;
      instate = 2;
    }
    iVar1 = rlen;
    local_24 = len;
    if (instate == 0) {
      if (len < rlen) {
        memcpy(buffer,current,(long)len);
        rlen = rlen - len;
        current = current + len;
      }
      else {
        local_24 = rlen;
        rlen = 0;
        memcpy(buffer,current,(long)iVar1);
        instate = 1;
        curlen = 0;
      }
    }
    else if (instate == 2) {
      if (len < rlen) {
        memcpy(buffer,current,(long)len);
        rlen = rlen - len;
        current = current + len;
      }
      else {
        local_24 = rlen;
        rlen = 0;
        memcpy(buffer,current,(long)iVar1);
        instate = 3;
        curlen = 0;
      }
    }
    else if (instate == 1) {
      if (0x1000 < len) {
        local_24 = 0x1000;
      }
      memcpy(buffer,filling,(long)local_24);
      curlen = (long)local_24 + curlen;
      if (maxlen <= curlen) {
        sVar2 = strlen(crazy);
        rlen = (int)sVar2 - crazy_indx;
        current = crazy + crazy_indx;
        instate = 2;
      }
    }
    else {
      local_24 = 0;
    }
    context_local._4_4_ = local_24;
  }
  return context_local._4_4_;
}

Assistant:

static int
crazyRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if ((check_time() <= 0) && (instate == 1)) {
        fprintf(stderr, "\ntimeout in crazy(%d)\n", crazy_indx);
        rlen = strlen(crazy) - crazy_indx;
        current = &crazy[crazy_indx];
        instate = 2;
    }
    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(crazy) - crazy_indx;
            current = &crazy[crazy_indx];
            instate = 2;
        }
    } else
      len = 0;
    return (len);
}